

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_bKGD(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  byte bVar1;
  uint uVar2;
  png_colorp ppVar3;
  int iVar4;
  png_uint_16 *ppVar5;
  ushort uVar6;
  png_uint_32 pVar7;
  char *pcVar8;
  png_uint_16 *ppVar9;
  ushort uVar10;
  png_byte buf [6];
  png_color_16 local_1a;
  
  uVar2 = png_ptr->mode;
  if ((uVar2 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if (((uVar2 & 4) != 0) ||
     (bVar1 = png_ptr->color_type, (char)((uVar2 & 2) >> 1) == '\0' && bVar1 == 3)) {
    png_crc_finish(png_ptr,length);
    pcVar8 = "out of place";
LAB_0011f03c:
    png_chunk_benign_error(png_ptr,pcVar8);
    return;
  }
  if ((info_ptr != (png_inforp)0x0) && ((info_ptr->valid & 0x20) != 0)) {
    png_crc_finish(png_ptr,length);
    pcVar8 = "duplicate";
    goto LAB_0011f03c;
  }
  pVar7 = 1;
  if (bVar1 != 3) {
    pVar7 = (uint)((bVar1 & 2) >> 1) * 4 + 2;
  }
  if (pVar7 != length) {
    png_crc_finish(png_ptr,length);
    pcVar8 = "invalid";
    goto LAB_0011f03c;
  }
  png_crc_read(png_ptr,buf,length);
  iVar4 = png_crc_finish(png_ptr,0);
  if (iVar4 != 0) {
    return;
  }
  ppVar5 = &local_1a.gray;
  if (png_ptr->color_type == 3) {
    local_1a.index = buf[0];
    if ((info_ptr == (png_inforp)0x0) || (info_ptr->num_palette == 0)) {
      local_1a.green = 0;
      local_1a.blue = 0;
      uVar6 = 0;
      ppVar9 = &local_1a.red;
      uVar10 = 0;
      goto LAB_0011f217;
    }
    uVar6 = (ushort)buf[0];
    if (info_ptr->num_palette <= uVar6) {
      pcVar8 = "invalid index";
      goto LAB_0011f23f;
    }
    ppVar3 = png_ptr->palette;
    local_1a.red = (png_uint_16)ppVar3[uVar6].red;
    local_1a.green = (png_uint_16)ppVar3[uVar6].green;
    uVar6 = (ushort)ppVar3[uVar6].blue;
  }
  else {
    bVar1 = png_ptr->bit_depth;
    if ((png_ptr->color_type & 2) == 0) {
      if ((bVar1 < 9) && ((buf[0] != '\0' || (buf[1] >> (bVar1 & 0x1f) != 0)))) {
        pcVar8 = "invalid gray level";
LAB_0011f23f:
        png_chunk_benign_error(png_ptr,pcVar8);
        return;
      }
      ppVar9 = &local_1a.green;
      local_1a.index = '\0';
      uVar6 = CONCAT11(buf[0],buf[1]);
      local_1a.blue = uVar6;
      ppVar5 = &local_1a.red;
      uVar10 = uVar6;
      goto LAB_0011f217;
    }
    if (bVar1 < 9) {
      if (((buf[0] != '\0') || (buf[2] != '\0')) || (buf[4] != '\0')) {
        pcVar8 = "invalid color";
        goto LAB_0011f23f;
      }
      uVar6 = 0;
      local_1a.green = 0;
    }
    else {
      local_1a.green = (ushort)buf[2] << 8;
      uVar6 = (ushort)buf[4] << 8;
    }
    local_1a.index = '\0';
    local_1a.red = CONCAT11(buf[0],buf[1]);
    local_1a.green = local_1a.green | buf[3];
    uVar6 = uVar6 | buf[5];
  }
  ppVar9 = &local_1a.blue;
  uVar10 = 0;
LAB_0011f217:
  *ppVar9 = uVar6;
  *ppVar5 = uVar10;
  png_set_bKGD(png_ptr,info_ptr,&local_1a);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_bKGD(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int truelen;
   png_byte buf[6];
   png_color_16 background;

   png_debug(1, "in png_handle_bKGD");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0 ||
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE &&
       (png_ptr->mode & PNG_HAVE_PLTE) == 0))
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_bKGD) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      truelen = 1;

   else if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
      truelen = 6;

   else
      truelen = 2;

   if (length != truelen)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, truelen);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* We convert the index value into RGB components so that we can allow
    * arbitrary RGB values for background when we have transparency, and
    * so it is easy to determine the RGB values of the background color
    * from the info_ptr struct.
    */
   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
   {
      background.index = buf[0];

      if (info_ptr != NULL && info_ptr->num_palette != 0)
      {
         if (buf[0] >= info_ptr->num_palette)
         {
            png_chunk_benign_error(png_ptr, "invalid index");
            return;
         }

         background.red = (png_uint_16)png_ptr->palette[buf[0]].red;
         background.green = (png_uint_16)png_ptr->palette[buf[0]].green;
         background.blue = (png_uint_16)png_ptr->palette[buf[0]].blue;
      }

      else
         background.red = background.green = background.blue = 0;

      background.gray = 0;
   }

   else if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) == 0) /* GRAY */
   {
      if (png_ptr->bit_depth <= 8)
      {
         if (buf[0] != 0 || buf[1] >= (unsigned int)(1 << png_ptr->bit_depth))
         {
            png_chunk_benign_error(png_ptr, "invalid gray level");
            return;
         }
      }

      background.index = 0;
      background.red =
      background.green =
      background.blue =
      background.gray = png_get_uint_16(buf);
   }

   else
   {
      if (png_ptr->bit_depth <= 8)
      {
         if (buf[0] != 0 || buf[2] != 0 || buf[4] != 0)
         {
            png_chunk_benign_error(png_ptr, "invalid color");
            return;
         }
      }

      background.index = 0;
      background.red = png_get_uint_16(buf);
      background.green = png_get_uint_16(buf + 2);
      background.blue = png_get_uint_16(buf + 4);
      background.gray = 0;
   }

   png_set_bKGD(png_ptr, info_ptr, &background);
}